

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_ipfs.c
# Opt level: O0

CURLcode ensure_trailing_slash(char **input)

{
  CURLcode CVar1;
  char *pcVar2;
  undefined1 local_40 [8];
  dynbuf dyn;
  size_t len;
  char **input_local;
  
  if (((*input != (char *)0x0) && (**input != '\0')) &&
     (dyn.toobig = strlen(*input), (*input)[dyn.toobig - 1] != '/')) {
    curlx_dyn_init((dynbuf *)local_40,dyn.toobig + 2);
    CVar1 = curlx_dyn_addn((dynbuf *)local_40,*input,dyn.toobig);
    if (CVar1 != CURLE_OK) {
      free(*input);
      *input = (char *)0x0;
      return CURLE_OUT_OF_MEMORY;
    }
    free(*input);
    *input = (char *)0x0;
    CVar1 = curlx_dyn_addn((dynbuf *)local_40,"/",1);
    if (CVar1 != CURLE_OK) {
      return CURLE_OUT_OF_MEMORY;
    }
    pcVar2 = curlx_dyn_ptr((dynbuf *)local_40);
    *input = pcVar2;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode ensure_trailing_slash(char **input)
{
  if(*input && **input) {
    size_t len = strlen(*input);
    if(((*input)[len - 1] != '/')) {
      struct curlx_dynbuf dyn;
      curlx_dyn_init(&dyn, len + 2);

      if(curlx_dyn_addn(&dyn, *input, len)) {
        Curl_safefree(*input);
        return CURLE_OUT_OF_MEMORY;
      }

      Curl_safefree(*input);

      if(curlx_dyn_addn(&dyn, "/", 1))
        return CURLE_OUT_OF_MEMORY;

      *input = curlx_dyn_ptr(&dyn);
    }
  }

  return CURLE_OK;
}